

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::Var::clear_sinks(Var *this,bool remove_parent)

{
  bool bVar1;
  int iVar2;
  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar3;
  undefined4 extraout_var;
  shared_ptr<kratos::AssignStmt> *stmt;
  iterator __end2;
  iterator __begin2;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range2;
  bool remove_parent_local;
  Var *this_local;
  
  if (remove_parent) {
    __end2 = std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::begin(&this->sinks_);
    stmt = (shared_ptr<kratos::AssignStmt> *)
           std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::end(&this->sinks_);
    while (bVar1 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                              ,(_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> *)
                               &stmt), bVar1) {
      this_00 = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )std::__detail::_Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
                 operator*(&__end2);
      peVar3 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      iVar2 = (*(peVar3->super_Stmt).super_IRNode._vptr_IRNode[4])();
      if (CONCAT44(extraout_var,iVar2) != 0) {
        peVar3 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_00);
        (*(peVar3->super_Stmt).super_IRNode._vptr_IRNode[9])();
      }
      std::__detail::_Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::operator++
                (&__end2);
    }
  }
  std::
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  ::clear(&this->sinks_);
  return;
}

Assistant:

void Var::clear_sinks(bool remove_parent) {  // NOLINT
    if (remove_parent) {
        for (auto const &stmt : sinks_) {
            if (stmt->parent()) stmt->remove_from_parent();
        }
    }

    sinks_.clear();
}